

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O1

_Bool player_stat_inc(player *p,wchar_t stat)

{
  uint32_t *puVar1;
  short sVar2;
  short sVar3;
  uint32_t uVar4;
  short sVar5;
  uint uVar6;
  
  sVar2 = p->stat_cur[stat];
  if (sVar2 < 0x76) {
    if (sVar2 < 0x12) {
      sVar3 = sVar2 + 1;
    }
    else {
      sVar3 = 0x76;
      if (sVar2 < 0x6c) {
        uVar6 = (0x76U - (int)sVar2 >> 1) + 3;
        uVar4 = Rand_div(uVar6 >> 1);
        sVar5 = (short)(uVar6 >> 2) + (short)uVar4 + p->stat_cur[stat] + 1;
        sVar3 = 0x75;
        if (sVar5 < 0x75) {
          sVar3 = sVar5;
        }
      }
    }
    p->stat_cur[stat] = sVar3;
    if (p->stat_max[stat] < sVar3) {
      p->stat_max[stat] = sVar3;
    }
    puVar1 = &p->upkeep->update;
    *puVar1 = *puVar1 | 1;
  }
  return sVar2 < 0x76;
}

Assistant:

bool player_stat_inc(struct player *p, int stat)
{
	int v = p->stat_cur[stat];

	if (v >= 18 + 100)
		return false;
	if (v < 18) {
		p->stat_cur[stat]++;
	} else if (v < 18 + 90) {
		int gain = (((18 + 100) - v) / 2 + 3) / 2;
		if (gain < 1)
			gain = 1;
		p->stat_cur[stat] += randint1(gain) + gain / 2;
		if (p->stat_cur[stat] > 18 + 99)
			p->stat_cur[stat] = 18 + 99;
	} else {
		p->stat_cur[stat] = 18 + 100;
	}

	if (p->stat_cur[stat] > p->stat_max[stat])
		p->stat_max[stat] = p->stat_cur[stat];
	
	p->upkeep->update |= PU_BONUS;
	return true;
}